

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O2

ssize_t __thiscall ImageBox::read(ImageBox *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  int iVar2;
  ssize_t sVar3;
  size_t __nbytes_00;
  void *__buf_00;
  undefined4 in_register_00000034;
  int tmp;
  ImageScaleType local_2c;
  
  iVar1 = Util::readInt32((uint8_t *)CONCAT44(in_register_00000034,__fd),(int *)&local_2c);
  this->imageScaleType = local_2c;
  NinePatchMargin::read(__fd + iVar1,&this->ninePatchMargin,__nbytes_00);
  iVar2 = Util::readString((uint8_t *)CONCAT44(in_register_00000034,__fd) + (long)iVar1 + 0x10,
                           &this->image);
  sVar3 = Widget::read(&this->super_Widget,iVar2 + __fd + iVar1 + 0x10,__buf_00,__nbytes);
  return sVar3;
}

Assistant:

uint8_t* ImageBox::read(uint8_t* buf)
{
	int tmp;
	buf += Util::readInt32(buf, tmp);
	imageScaleType = static_cast<ImageScaleType>(tmp);
	buf += NinePatchMargin::read(buf, ninePatchMargin);
	buf += Util::readString(buf, image);
	return Widget::read(buf);
}